

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::computeTexCoordVecs<3>
               (vector<float,_std::allocator<float>_> *texCoords,Vector<float,_3> (*dst) [4])

{
  value_type vVar1;
  const_reference pvVar2;
  float *pfVar3;
  int local_20;
  int local_1c;
  int j;
  int i;
  Vector<float,_3> (*dst_local) [4];
  vector<float,_std::allocator<float>_> *texCoords_local;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         (texCoords,(long)(local_1c * 3 + local_20));
      vVar1 = *pvVar2;
      pfVar3 = tcu::Vector<float,_3>::operator[](*dst + local_1c,local_20);
      *pfVar3 = vVar1;
    }
  }
  return;
}

Assistant:

static inline void computeTexCoordVecs (const vector<float>& texCoords, tcu::Vector<float, N> (&dst)[4])
{
	DE_ASSERT((int)texCoords.size() == 4*N);
	for (int i = 0; i < 4; i++)
	for (int j = 0; j < N; j++)
		dst[i][j] = texCoords[i*N + j];
}